

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void rorx_(PDISASM pMyDisasm)

{
  uint uVar1;
  
  if ((((pMyDisasm->Reserved_).EVEX.state != '\x01') && ((pMyDisasm->Reserved_).VEX.state == '\x01')
      ) && ((pMyDisasm->Reserved_).VEX.pp == '\x03')) {
    (pMyDisasm->Instruction).Category = 0x160000;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"rorx",5);
    if ((pMyDisasm->Reserved_).VEX.L != '\0') {
      (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
    }
    uVar1 = (uint)((pMyDisasm->Reserved_).REX.W_ == '\x01');
    (pMyDisasm->Reserved_).OperandSize = uVar1 * 0x20 + 0x20;
    (pMyDisasm->Reserved_).MemDecoration = uVar1 + 0x67;
    decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
    decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).EIP_ =
         (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
    getImmediat8(&pMyDisasm->Operand3,pMyDisasm);
    return;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ rorx_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
  }
  else if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 3) {
      pMyDisasm->Instruction.Category = BMI2_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rorx");
      #endif
      if (GV.VEX.L != 0) GV.ERROR_OPCODE = UD_;
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      GV.MemDecoration = (GV.REX.W_ == 1) ? Arg2qword : Arg2dword;
      GxEx(pMyDisasm);
      getImmediat8(&pMyDisasm->Operand3, pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
}